

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.h
# Opt level: O2

void __thiscall
BibEntryIssue::BibEntryIssue(BibEntryIssue *this,TSRange range,Severity sev,int code,string *msg)

{
  allocator<char> local_11;
  
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_00203cd8;
  (this->range).start_point = range.start_point;
  (this->range).end_point = range.end_point;
  (this->range).start_byte = range.start_byte;
  (this->range).end_byte = range.end_byte;
  this->severity = sev;
  this->code = code;
  std::__cxx11::string::string((string *)&this->message,(string *)msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->source,"biber",&local_11);
  return;
}

Assistant:

BibEntryIssue (TSRange range, Severity sev, int code, string msg) : range { range }, severity { sev }, code { code }, message { msg } {}